

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::GrowCapacity
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  ushort uVar1;
  Arena *this_00;
  KeyValue *flat;
  ushort uVar2;
  KeyValue *pKVar3;
  const_iterator __pos;
  size_t n;
  ulong n_00;
  long lVar4;
  bool bVar5;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_50;
  
  uVar2 = this->flat_capacity_;
  if (uVar2 < minimum_new_capacity && uVar2 < 0x101) {
    do {
      bVar5 = uVar2 == 0;
      uVar2 = uVar2 * 4;
      if (bVar5) {
        uVar2 = 1;
      }
    } while (uVar2 < minimum_new_capacity);
    this->flat_capacity_ = uVar2;
    this_00 = this->arena_;
    flat = (this->map_).flat;
    uVar1 = this->flat_size_;
    if (uVar2 < 0x101) {
      n_00 = (ulong)uVar2 << 5;
      if (this_00 == (Arena *)0x0) {
        pKVar3 = (KeyValue *)operator_new__(n_00);
      }
      else {
        Arena::AllocHook(this_00,(type_info *)&KeyValue::typeinfo,n_00);
        pKVar3 = (KeyValue *)ArenaImpl::AllocateAligned(&this_00->impl_,n_00);
      }
      (this->map_).flat = pKVar3;
      if (uVar1 != 0) {
        memmove(pKVar3,flat,(ulong)uVar1 << 5);
      }
    }
    else {
      if (this_00 == (Arena *)0x0) {
        pKVar3 = (KeyValue *)operator_new(0x30);
        (pKVar3->second).type = '\0';
        (pKVar3->second).is_repeated = false;
        (pKVar3->second).field_0xa = 0;
        (pKVar3->second).is_packed = false;
        (pKVar3->second).cached_size = 0;
        (pKVar3->second).descriptor = (FieldDescriptor *)0x0;
        *(undefined8 *)pKVar3 = 0;
        (pKVar3->second).field_0.int64_value = 0;
      }
      else {
        Arena::AllocHook(this_00,(type_info *)
                                 &std::
                                  map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                                  ::typeinfo,0x30);
        pKVar3 = (KeyValue *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (&this_00->impl_,0x30,
                            arena_destruct_object<std::map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>>
                           );
        *(undefined8 *)pKVar3 = 0;
        (pKVar3->second).field_0.int64_value = 0;
        (pKVar3->second).type = '\0';
        (pKVar3->second).is_repeated = false;
        (pKVar3->second).field_0xa = 0;
        (pKVar3->second).is_packed = false;
        (pKVar3->second).cached_size = 0;
      }
      (pKVar3->second).descriptor = (FieldDescriptor *)&pKVar3->second;
      *(Extension **)(pKVar3 + 1) = &pKVar3->second;
      pKVar3[1].second.field_0.int64_value = 0;
      (this->map_).flat = pKVar3;
      __pos._M_node = (_Base_ptr)(pKVar3->second).descriptor;
      pKVar3 = flat;
      for (lVar4 = (ulong)uVar1 << 5; lVar4 != 0; lVar4 = lVar4 + -0x20) {
        local_50.first = pKVar3->first;
        local_50.second.descriptor = (pKVar3->second).descriptor;
        local_50.second.field_0 = (pKVar3->second).field_0;
        local_50.second.type = (pKVar3->second).type;
        local_50.second.is_repeated = (pKVar3->second).is_repeated;
        local_50.second._10_1_ = (pKVar3->second).field_0xa;
        local_50.second.is_packed = (pKVar3->second).is_packed;
        local_50.second.cached_size = (pKVar3->second).cached_size;
        __pos._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
             ::
             _M_insert_unique_<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                       ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                         *)(this->map_).flat,__pos,&local_50);
        pKVar3 = pKVar3 + 1;
      }
      this->flat_size_ = 0;
    }
    if (this->arena_ == (Arena *)0x0) {
      DeleteFlatMap(flat,0);
    }
  }
  return;
}

Assistant:

bool is_large() const { return flat_capacity_ > kMaximumFlatCapacity; }